

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.hpp
# Opt level: O2

void __thiscall helics::Input::getValue_impl<helics::NamedPoint>(Input *this,NamedPoint *param_2)

{
  bool bVar1;
  DataType baseType;
  data_view dv;
  defV val;
  data_view local_68;
  _Variadic_union<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  local_48;
  undefined1 local_20;
  
  checkAndGetFedUpdate(&local_68,this);
  if (local_68.dblock._M_len != 0) {
    baseType = this->injectionType;
    if (baseType == HELICS_UNKNOWN) {
      loadSourceInformation(this);
      baseType = this->injectionType;
    }
    if (baseType == HELICS_INT) {
      local_48._M_first._M_storage = (_Uninitialized<double,_true>)0.0;
      local_20 = 0;
      integerExtractAndConvert
                ((defV *)&local_48._M_first,&local_68,&this->inputUnits,&this->outputUnits);
      helics::valueExtract((defV *)&local_48._M_first,param_2);
LAB_001feebf:
      std::__detail::__variant::
      _Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
      ::~_Variant_storage((_Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                           *)&local_48._M_first);
    }
    else {
      if (baseType == HELICS_DOUBLE) {
        local_48._M_first._M_storage =
             (_Uninitialized<double,_true>)
             doubleExtractAndConvert(&local_68,&this->inputUnits,&this->outputUnits);
        local_20 = 0;
        helics::valueExtract((defV *)&local_48._M_first,param_2);
        goto LAB_001feebf;
      }
      helics::valueExtract(&local_68,baseType,param_2);
    }
    if ((this->changeDetectionEnabled != true) ||
       (bVar1 = changeDetected(&this->lastValue,param_2,this->delta), bVar1)) {
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                   *)&this->lastValue,param_2);
      goto LAB_001fef0f;
    }
  }
  helics::valueExtract(&this->lastValue,param_2);
LAB_001fef0f:
  this->hasUpdate = false;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void Input::getValue_impl(std::integral_constant<int, primaryType> /*V*/, X& out)
{
    auto dv = checkAndGetFedUpdate();
    if (!dv.empty()) {
        if (injectionType == DataType::HELICS_UNKNOWN) {
            loadSourceInformation();
        }

        if (injectionType == helics::DataType::HELICS_DOUBLE) {
            defV val = doubleExtractAndConvert(dv, inputUnits, outputUnits);
            valueExtract(val, out);
        } else if (injectionType == helics::DataType::HELICS_INT) {
            defV val;
            integerExtractAndConvert(val, dv, inputUnits, outputUnits);
            valueExtract(val, out);
        } else {
            valueExtract(dv, injectionType, out);
        }
        if (changeDetectionEnabled) {
            if (changeDetected(lastValue, out, delta)) {
                lastValue = make_valid(out);
            } else {
                valueExtract(lastValue, out);
            }
        } else {
            lastValue = make_valid(out);
        }
    } else {
        valueExtract(lastValue, out);
    }
    hasUpdate = false;
}